

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig::operator==
          (JavaHprofConfig_ContinuousDumpConfig *this,JavaHprofConfig_ContinuousDumpConfig *other)

{
  __type_conflict4 _Var1;
  bool local_19;
  JavaHprofConfig_ContinuousDumpConfig *other_local;
  JavaHprofConfig_ContinuousDumpConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (((_Var1) && (local_19 = false, this->dump_phase_ms_ == other->dump_phase_ms_)) &&
     (local_19 = false, this->dump_interval_ms_ == other->dump_interval_ms_)) {
    local_19 = (this->scan_pids_only_on_start_ & 1U) == (other->scan_pids_only_on_start_ & 1U);
  }
  return local_19;
}

Assistant:

bool JavaHprofConfig_ContinuousDumpConfig::operator==(const JavaHprofConfig_ContinuousDumpConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && dump_phase_ms_ == other.dump_phase_ms_
   && dump_interval_ms_ == other.dump_interval_ms_
   && scan_pids_only_on_start_ == other.scan_pids_only_on_start_;
}